

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O1

vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> * __thiscall
xmrig::CudaConfig::get
          (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
           *__return_storage_ptr__,CudaConfig *this,Miner *miner,
          vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  pointer pCVar1;
  pointer pCVar2;
  CudaThread *pCVar3;
  pointer pCVar4;
  int iVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  CudaThread *thread;
  CudaThread *__args_1;
  Miner *local_48;
  String local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = miner;
  String::String(&local_40,"cn/blur");
  pmVar6 = std::
           map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
           ::at(&(this->m_threads).m_profiles,&local_40);
  if (local_40.m_data != (char *)0x0) {
    operator_delete__(local_40.m_data);
  }
  pCVar1 = (pmVar6->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (pmVar6->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1 != pCVar2) {
    std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::reserve
              (__return_storage_ptr__,(long)pCVar2 - (long)pCVar1 >> 5);
    pCVar3 = (pmVar6->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__args_1 = (pmVar6->m_data).
                    super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
                    _M_impl.super__Vector_impl_data._M_start; __args_1 != pCVar3;
        __args_1 = __args_1 + 1) {
      pCVar4 = (devices->super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(devices->
                    super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar4;
      iVar5 = -1;
      if (lVar8 != 0) {
        uVar9 = (lVar8 >> 4) * -0x5555555555555555;
        uVar10 = 0;
        do {
          iVar5 = (int)uVar10;
          if (pCVar4[uVar10].m_index == __args_1->m_index) break;
          uVar10 = (ulong)((int)uVar10 + 1);
          iVar5 = -1;
        } while (uVar10 <= uVar9 && uVar9 - uVar10 != 0);
      }
      if (iVar5 == -1) {
        pcVar7 = cuda_tag();
        Log::print(INFO,
                   "%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                   pcVar7,(ulong)__args_1->m_index);
      }
      else {
        std::vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>>::
        emplace_back<xmrig::Miner_const*&,xmrig::CudaThread_const&,xmrig::CudaDevice_const&>
                  ((vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>> *)
                   __return_storage_ptr__,&local_48,__args_1,pCVar4 + iVar5);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::CudaLaunchData> xmrig::CudaConfig::get(const Miner *miner, const std::vector<CudaDevice> &devices) const
{
    auto deviceIndex = [&devices](uint32_t index) -> int {
        for (uint32_t i = 0; i < devices.size(); ++i) {
            if (devices[i].index() == index) {
                return i;
            }
        }

        return -1;
    };

    std::vector<CudaLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count());

    for (const auto &thread : threads.data()) {
        const int index = deviceIndex(thread.index());
        if (index == -1) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), cuda_tag(), thread.index());
            continue;
        }

        out.emplace_back(miner, thread, devices[static_cast<size_t>(index)]);
    }

    return out;
}